

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O1

void __thiscall duckdb::Iterator::Iterator(Iterator *this,ART *art)

{
  (this->current_key).key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->current_key).key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->current_key).key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->art = art;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->nodes).c.super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>::
  _M_initialize_map((_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_> *)
                    &this->nodes,0);
  (this->last_leaf).super_IndexPointer.data = 0;
  this->status = GATE_NOT_SET;
  this->nested_depth = '\0';
  this->entered_nested_leaf = false;
  return;
}

Assistant:

explicit Iterator(ART &art) : art(art), status(GateStatus::GATE_NOT_SET) {}